

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int stbtt_IsGlyphEmpty(stbtt_fontinfo *info,int glyph_index)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  stbtt__csctx local_48;
  
  if ((info->cff).size == 0) {
    uVar3 = stbtt__GetGlyfOffset(info,glyph_index);
    if ((int)uVar3 < 0) {
      bVar1 = true;
    }
    else {
      bVar1 = info->data[(ulong)uVar3 + 1] == '\0' && info->data[uVar3] == '\0';
    }
  }
  else {
    local_48.first_x = 0.0;
    local_48.first_y = 0.0;
    local_48.min_y = 0;
    local_48.max_y = 0;
    local_48.pvertices = (stbtt_vertex *)0x0;
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_48.min_x = 0;
    local_48.max_x = 0;
    local_48.num_vertices = 0;
    local_48._52_4_ = 0;
    local_48.bounds = 1;
    local_48.started = 0;
    iVar2 = stbtt__run_charstring(info,glyph_index,&local_48);
    bVar1 = local_48.num_vertices == 0 || iVar2 == 0;
  }
  return (int)bVar1;
}

Assistant:

STBTT_DEF int stbtt_IsGlyphEmpty(const stbtt_fontinfo *info, int glyph_index)
{
stbtt_int16 numberOfContours;
int g;
if (info->cff.size)
return stbtt__GetGlyphInfoT2(info, glyph_index, NULL, NULL, NULL, NULL) == 0;
g = stbtt__GetGlyfOffset(info, glyph_index);
if (g < 0) return 1;
numberOfContours = ttSHORT(info->data + g);
return numberOfContours == 0;
}